

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O2

void load_buffer_8x8_avx2(int16_t *input,__m256i *out,int stride,int flipud,int fliplr,int shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  __m256i alVar16;
  __m256i alVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  
  lVar24 = 0;
  bVar26 = flipud == 0;
  iVar18 = stride * 3;
  if (bVar26) {
    iVar18 = stride * 4;
  }
  iVar19 = stride;
  iVar20 = stride * 2;
  iVar21 = stride * 4;
  iVar22 = stride * 5;
  if (bVar26) {
    iVar19 = stride * 6;
    iVar20 = stride * 5;
    iVar21 = stride * 3;
    iVar22 = stride * 2;
  }
  lVar25 = (long)(stride * 7);
  iVar23 = stride * 6;
  if (bVar26) {
    iVar23 = stride;
  }
  if (!bVar26) {
    lVar24 = lVar25;
    lVar25 = 0;
  }
  auVar27 = *(undefined1 (*) [16])(input + lVar24);
  auVar1 = *(undefined1 (*) [16])(input + iVar23);
  auVar2 = *(undefined1 (*) [16])(input + iVar22);
  auVar3 = *(undefined1 (*) [16])(input + iVar21);
  auVar4 = *(undefined1 (*) [16])(input + iVar18);
  auVar5 = *(undefined1 (*) [16])(input + iVar20);
  auVar6 = *(undefined1 (*) [16])(input + iVar19);
  auVar7 = *(undefined1 (*) [16])(input + lVar25);
  if (fliplr != 0) {
    auVar27 = vpshufb_avx(auVar27,_DAT_004bc800);
    auVar1 = vpshufb_avx(auVar1,_DAT_004bc800);
    auVar2 = vpshufb_avx(auVar2,_DAT_004bc800);
    auVar3 = vpshufb_avx(auVar3,_DAT_004bc800);
    auVar4 = vpshufb_avx(auVar4,_DAT_004bc800);
    auVar5 = vpshufb_avx(auVar5,_DAT_004bc800);
    auVar6 = vpshufb_avx(auVar6,_DAT_004bc800);
    auVar7 = vpshufb_avx(auVar7,_DAT_004bc800);
  }
  auVar8 = vpmovsxwd_avx2(auVar27);
  auVar9 = vpmovsxwd_avx2(auVar1);
  auVar10 = vpmovsxwd_avx2(auVar2);
  auVar11 = vpmovsxwd_avx2(auVar3);
  auVar12 = vpmovsxwd_avx2(auVar4);
  auVar13 = vpmovsxwd_avx2(auVar7);
  auVar14 = vpmovsxwd_avx2(auVar6);
  auVar15 = vpmovsxwd_avx2(auVar5);
  alVar16 = (__m256i)vpslld_avx2(auVar8,ZEXT416((uint)shift));
  alVar17 = (__m256i)vpslld_avx2(auVar9,ZEXT416((uint)shift));
  *out = alVar16;
  out[1] = alVar17;
  auVar27 = ZEXT416((uint)shift);
  alVar16 = (__m256i)vpslld_avx2(auVar10,auVar27);
  out[2] = alVar16;
  alVar16 = (__m256i)vpslld_avx2(auVar11,auVar27);
  out[3] = alVar16;
  alVar16 = (__m256i)vpslld_avx2(auVar12,auVar27);
  alVar17 = (__m256i)vpslld_avx2(auVar15,auVar27);
  out[4] = alVar16;
  out[5] = alVar17;
  alVar16 = (__m256i)vpslld_avx2(auVar14,ZEXT416((uint)shift));
  out[6] = alVar16;
  alVar16 = (__m256i)vpslld_avx2(auVar13,ZEXT416((uint)shift));
  out[7] = alVar16;
  return;
}

Assistant:

static inline void load_buffer_8x8_avx2(const int16_t *input, __m256i *out,
                                        int stride, int flipud, int fliplr,
                                        int shift) {
  __m128i out1[8];
  if (!flipud) {
    out1[0] = _mm_load_si128((const __m128i *)(input + 0 * stride));
    out1[1] = _mm_load_si128((const __m128i *)(input + 1 * stride));
    out1[2] = _mm_load_si128((const __m128i *)(input + 2 * stride));
    out1[3] = _mm_load_si128((const __m128i *)(input + 3 * stride));
    out1[4] = _mm_load_si128((const __m128i *)(input + 4 * stride));
    out1[5] = _mm_load_si128((const __m128i *)(input + 5 * stride));
    out1[6] = _mm_load_si128((const __m128i *)(input + 6 * stride));
    out1[7] = _mm_load_si128((const __m128i *)(input + 7 * stride));

  } else {
    out1[7] = _mm_load_si128((const __m128i *)(input + 0 * stride));
    out1[6] = _mm_load_si128((const __m128i *)(input + 1 * stride));
    out1[5] = _mm_load_si128((const __m128i *)(input + 2 * stride));
    out1[4] = _mm_load_si128((const __m128i *)(input + 3 * stride));
    out1[3] = _mm_load_si128((const __m128i *)(input + 4 * stride));
    out1[2] = _mm_load_si128((const __m128i *)(input + 5 * stride));
    out1[1] = _mm_load_si128((const __m128i *)(input + 6 * stride));
    out1[0] = _mm_load_si128((const __m128i *)(input + 7 * stride));
  }
  if (!fliplr) {
    out[0] = _mm256_cvtepi16_epi32(out1[0]);
    out[1] = _mm256_cvtepi16_epi32(out1[1]);
    out[2] = _mm256_cvtepi16_epi32(out1[2]);
    out[3] = _mm256_cvtepi16_epi32(out1[3]);
    out[4] = _mm256_cvtepi16_epi32(out1[4]);
    out[5] = _mm256_cvtepi16_epi32(out1[5]);
    out[6] = _mm256_cvtepi16_epi32(out1[6]);
    out[7] = _mm256_cvtepi16_epi32(out1[7]);

  } else {
    out[0] = _mm256_cvtepi16_epi32(mm_reverse_epi16(out1[0]));
    out[1] = _mm256_cvtepi16_epi32(mm_reverse_epi16(out1[1]));
    out[2] = _mm256_cvtepi16_epi32(mm_reverse_epi16(out1[2]));
    out[3] = _mm256_cvtepi16_epi32(mm_reverse_epi16(out1[3]));
    out[4] = _mm256_cvtepi16_epi32(mm_reverse_epi16(out1[4]));
    out[5] = _mm256_cvtepi16_epi32(mm_reverse_epi16(out1[5]));
    out[6] = _mm256_cvtepi16_epi32(mm_reverse_epi16(out1[6]));
    out[7] = _mm256_cvtepi16_epi32(mm_reverse_epi16(out1[7]));
  }
  out[0] = _mm256_slli_epi32(out[0], shift);
  out[1] = _mm256_slli_epi32(out[1], shift);
  out[2] = _mm256_slli_epi32(out[2], shift);
  out[3] = _mm256_slli_epi32(out[3], shift);
  out[4] = _mm256_slli_epi32(out[4], shift);
  out[5] = _mm256_slli_epi32(out[5], shift);
  out[6] = _mm256_slli_epi32(out[6], shift);
  out[7] = _mm256_slli_epi32(out[7], shift);
}